

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.h
# Opt level: O0

void __thiscall dlib::impl1::bsp_con::bsp_con(bsp_con *this,network_address *dest)

{
  socklen_t in_EDX;
  sockaddr *in_RSI;
  long in_RDI;
  connection *in_stack_ffffffffffffffb8;
  unique_ptr<dlib::connection,_std::default_delete<dlib::connection>_> *in_stack_ffffffffffffffc0;
  sockstreambuf *in_stack_ffffffffffffffe0;
  
  connect((int)in_RSI,in_RSI,in_EDX);
  std::unique_ptr<dlib::connection,std::default_delete<dlib::connection>>::
  unique_ptr<std::default_delete<dlib::connection>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sockstreambuf::sockstreambuf
            (in_stack_ffffffffffffffe0,
             (unique_ptr<dlib::connection,_std::default_delete<dlib::connection>_> *)(in_RDI + 8));
  std::iostream::iostream((void *)(in_RDI + 0x68),(streambuf *)(in_RDI + 8));
  *(undefined1 *)(in_RDI + 0x188) = 0;
  std::unique_ptr<dlib::connection,_std::default_delete<dlib::connection>_>::operator->
            ((unique_ptr<dlib::connection,_std::default_delete<dlib::connection>_> *)0x3c6e39);
  connection::disable_nagle(in_stack_ffffffffffffffb8);
  return;
}

Assistant:

bsp_con(
                const network_address& dest
            ) : 
                con(connect(dest)),
                buf(con),
                stream(&buf),
                terminated(false)
            {
                con->disable_nagle();
            }